

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx512f.hpp
# Opt level: O2

float xsimd::kernel::reduce_add<xsimd::avx512bw>
                (batch<float,_xsimd::avx512bw> *rhs,requires_arch<avx512f> param_2)

{
  undefined1 auVar1 [16];
  
  auVar1._0_4_ = (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[0] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[4] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[8] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[0xc];
  auVar1._4_4_ = (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[1] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[5] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[9] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[0xd];
  auVar1._8_4_ = (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[2] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[6] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[10] +
                 (rhs->super_simd_register<float,_xsimd::avx512bw>).
                 super_simd_register<float,_xsimd::avx512dq>.
                 super_simd_register<float,_xsimd::avx512cd>.
                 super_simd_register<float,_xsimd::avx512f>.data[0xe];
  auVar1._12_4_ =
       (rhs->super_simd_register<float,_xsimd::avx512bw>).
       super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
       super_simd_register<float,_xsimd::avx512f>.data[3] +
       (rhs->super_simd_register<float,_xsimd::avx512bw>).
       super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
       super_simd_register<float,_xsimd::avx512f>.data[7] +
       (rhs->super_simd_register<float,_xsimd::avx512bw>).
       super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
       super_simd_register<float,_xsimd::avx512f>.data[0xb] +
       (rhs->super_simd_register<float,_xsimd::avx512bw>).
       super_simd_register<float,_xsimd::avx512dq>.super_simd_register<float,_xsimd::avx512cd>.
       super_simd_register<float,_xsimd::avx512f>.data[0xf];
  auVar1 = vhaddps_avx(auVar1,auVar1);
  auVar1 = vhaddps_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

inline float reduce_add(batch<float, A> const& rhs, requires_arch<avx512f>) noexcept
        {
            __m128 tmp1 = _mm512_extractf32x4_ps(rhs, 0);
            __m128 tmp2 = _mm512_extractf32x4_ps(rhs, 1);
            __m128 tmp3 = _mm512_extractf32x4_ps(rhs, 2);
            __m128 tmp4 = _mm512_extractf32x4_ps(rhs, 3);
            __m128 res1 = _mm_add_ps(tmp1, tmp2);
            __m128 res2 = _mm_add_ps(tmp3, tmp4);
            __m128 res3 = _mm_add_ps(res1, res2);
            return reduce_add(batch<float, sse4_2>(res3), sse4_2 {});
        }